

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestExternalCall.cpp
# Opt level: O0

int TestExtM2(double x1,double x2,double x3,double x4,int y)

{
  double dVar1;
  undefined1 local_39;
  double xgap;
  int y_local;
  double x4_local;
  double x3_local;
  double x2_local;
  double x1_local;
  
  dVar1 = floor(x1 + 0.5);
  local_39 = false;
  if (((int)(((x1 + 0.5) - dVar1) * 10.0) == 1) && (local_39 = false, y != 0)) {
    local_39 = false;
    if ((x2 == 2.0) && (!NAN(x2))) {
      local_39 = false;
      if ((x3 == 3.0) && (!NAN(x3))) {
        local_39 = x4 == 4.0;
      }
    }
  }
  return (int)local_39;
}

Assistant:

int TestExtM2(double x1, double x2, double x3, double x4, int y)
{
#define fpart(x) (x - floor(x))
	double xgap = fpart(x1 + 0.5);
	return int(xgap * 10.0) == 1 && y && x2 == 2.0 && x3 == 3.0 && x4 == 4.0;
#undef fpart
}